

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::AddEdgeCrossings(S2Builder *this,MutableS2ShapeIndex *input_edge_index)

{
  pointer index;
  bool bVar1;
  reference v;
  Vector3<double> *vertex;
  iterator __end2;
  iterator __begin2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__range2;
  anon_class_8_1_4a6121b6 local_58;
  EdgePairVisitor local_50;
  undefined1 local_30 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> new_vertices;
  MutableS2ShapeIndex *input_edge_index_local;
  S2Builder *this_local;
  
  new_vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)input_edge_index;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
  index = new_vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.new_vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30;
  std::function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)>::
  function<S2Builder::AddEdgeCrossings(MutableS2ShapeIndex_const&)::__0,void>
            ((function<bool(s2shapeutil::ShapeEdge_const&,s2shapeutil::ShapeEdge_const&,bool)> *)
             &local_50,&local_58);
  s2shapeutil::VisitCrossingEdgePairs((S2ShapeIndex *)index,INTERIOR,&local_50);
  std::function<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool)>::
  ~function(&local_50);
  bVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty
                    ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
  if (!bVar1) {
    this->snapping_needed_ = true;
    __end2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin
                       ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
    vertex = (Vector3<double> *)
             std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end
                       ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                                       *)&vertex), bVar1) {
      v = __gnu_cxx::
          __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
          ::operator*(&__end2);
      AddVertex(this,v);
      __gnu_cxx::
      __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
  return;
}

Assistant:

void S2Builder::AddEdgeCrossings(const MutableS2ShapeIndex& input_edge_index) {
  // We need to build a list of intersections and add them afterwards so that
  // we don't reallocate vertices_ during the VisitCrossings() call.
  vector<S2Point> new_vertices;
  s2shapeutil::VisitCrossingEdgePairs(
      input_edge_index, s2shapeutil::CrossingType::INTERIOR,
      [&new_vertices](const s2shapeutil::ShapeEdge& a,
                      const s2shapeutil::ShapeEdge& b, bool) {
        new_vertices.push_back(
            S2::GetIntersection(a.v0(), a.v1(), b.v0(), b.v1()));
        return true;  // Continue visiting.
      });
  if (!new_vertices.empty()) {
    snapping_needed_ = true;
    for (const auto& vertex : new_vertices) AddVertex(vertex);
  }
}